

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * sx_skip_whitespace(char *str)

{
  _Bool _Var1;
  char *local_10;
  char *str_local;
  
  local_10 = str;
  while ((*local_10 != '\0' && (_Var1 = sx_isspace(*local_10), _Var1))) {
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

const char* sx_skip_whitespace(const char* str)
{
    while (*str) {
        if (sx_isspace(*str))
            ++str;
        else
            break;
    }
    return str;
}